

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

void __thiscall sznet::net::TcpConnection::handleError(TcpConnection *this)

{
  ulong __n;
  int v;
  LogStream *this_00;
  char **ppcVar1;
  char *pcVar2;
  ulong uVar3;
  SourceFile file;
  Logger local_ff8;
  
  v = sockets::sz_sock_geterror
                (((this->m_socket)._M_t.
                  super___uniq_ptr_impl<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_sznet::net::Socket_*,_std::default_delete<sznet::net::Socket>_>
                  .super__Head_base<0UL,_sznet::net::Socket_*,_false>._M_head_impl)->m_sockfd);
  file._8_8_ = 0x11;
  file.m_data = "TcpConnection.cpp";
  Logger::Logger(&local_ff8,file,0x1aa,ERROR);
  uVar3 = (long)&local_ff8 + (0xfb0 - (long)local_ff8.m_impl.m_stream.m_buffer.m_cur);
  if (0x1c < (uint)uVar3) {
    builtin_strncpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,"TcpConnection::handleError [",0x1c);
    local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + 0x1c;
    uVar3 = (long)&local_ff8 + (0xfb0 - (long)local_ff8.m_impl.m_stream.m_buffer.m_cur);
  }
  __n = (this->m_name)._M_string_length;
  if (__n < (ulong)(long)(int)uVar3) {
    memcpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,(this->m_name)._M_dataplus._M_p,__n);
    local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + __n;
    uVar3 = (long)&local_ff8 + (0xfb0 - (long)local_ff8.m_impl.m_stream.m_buffer.m_cur);
  }
  if ((uVar3 & 0xfffffff0) != 0) {
    builtin_strncpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,"] - SO_ERROR = ",0xf);
    local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + 0xf;
  }
  this_00 = LogStream::operator<<(&local_ff8.m_impl.m_stream,v);
  pcVar2 = (this_00->m_buffer).m_cur;
  ppcVar1 = &(this_00->m_buffer).m_cur;
  if (((int)ppcVar1 - (int)pcVar2 & 0xfffffffeU) != 0) {
    *pcVar2 = ' ';
    *ppcVar1 = *ppcVar1 + 1;
  }
  pcVar2 = sz_strerror_tl(v);
  LogStream::operator<<(this_00,pcVar2);
  Logger::~Logger(&local_ff8);
  return;
}

Assistant:

void TcpConnection::handleError()
{
	int err = sockets::sz_sock_geterror(m_socket->fd());
	LOG_ERROR << "TcpConnection::handleError [" << m_name
		<< "] - SO_ERROR = " << err << " " << sz_strerror_tl(err);
}